

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_int rf_get_pkm_image_size(void *src,rf_int src_size)

{
  long lVar1;
  _Bool _Var2;
  long *in_FS_OFFSET;
  undefined4 uStack_4c;
  int local_30;
  undefined8 uStack_2c;
  int bpp;
  rf_pkm_header header;
  int result;
  rf_int src_size_local;
  void *src_local;
  
  header.width = 0;
  header.height = 0;
  if ((src != (void *)0x0) && (0x10 < (ulong)src_size)) {
    uStack_2c = *src;
    header._0_8_ = *(undefined8 *)((long)src + 8);
    unique0x100000fa = src_size;
    _Var2 = rf_match_str_cstr((char *)&stack0xffffffffffffffd4,4,"PKM ");
    if (_Var2) {
      local_30 = 4;
      if ((ushort)(bpp._2_2_ << 8 | bpp._2_2_ >> 8) == 3) {
        local_30 = 8;
      }
      header._8_4_ = (int)((uint)(ushort)(header.id._0_2_ << 8 | (ushort)header.id._0_2_ >> 8) *
                           (uint)(ushort)(header.id._2_2_ << 8 | (ushort)header.id._2_2_ >> 8) *
                          local_30) / 8;
    }
    else {
      rf_log_impl(8,0x1b2ec9,(char *)0x5);
      lVar1 = *in_FS_OFFSET;
      *(char **)(lVar1 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar1 + -0x458) = "rf_get_pkm_image_size";
      *(undefined8 *)(lVar1 + -0x450) = 0x45a6;
      *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_4c,5);
    }
  }
  return (long)(int)header._8_4_;
}

Assistant:

RF_API rf_int rf_get_pkm_image_size(const void* src, rf_int src_size)
{
    int result = 0;

    if (src && src_size > sizeof(rf_pkm_header))
    {
        rf_pkm_header header = *(rf_pkm_header*)src;

        // Verify the type of file
        if (rf_match_str_cstr(header.id, sizeof(header.id), "PKM "))
        {
            // Note: format, width and height come as big-endian, data must be swapped to little-endian
            header.format = ((header.format & 0x00FF) << 8) | ((header.format & 0xFF00) >> 8);
            header.width  = ((header.width  & 0x00FF) << 8) | ((header.width  & 0xFF00) >> 8);
            header.height = ((header.height & 0x00FF) << 8) | ((header.height & 0xFF00) >> 8);

            int bpp = 4;
            if (header.format == 3) bpp = 8;

            result = header.width * header.height * bpp / 8;
        }
        else RF_LOG_ERROR(RF_BAD_FORMAT, "PKM file does not seem to be a valid image");
    }

    return result;
}